

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O0

char * test_matrix4_transformation_translatev3(void)

{
  int iVar1;
  undefined1 local_74 [8];
  vector3 expectedPosition;
  vector3 translation;
  vector3 startingPosition;
  matrix4 transform;
  
  translation.field_0._4_8_ = 0x3f80000000000000;
  startingPosition.field_0.v[0] = 0.0;
  expectedPosition.field_0._4_8_ = 0x3dcccccd3dcccccd;
  translation.field_0.v[0] = 0.1;
  local_74 = (undefined1  [8])0x3f8ccccd3dcccccd;
  expectedPosition.field_0.v[0] = 0.1;
  matrix4_make_transformation_translationv3
            ((matrix4 *)((long)&startingPosition.field_0 + 4),
             (vector3 *)((long)&expectedPosition.field_0 + 4));
  vector3_multiplym4((vector3 *)((long)&translation.field_0 + 4),
                     (matrix4 *)((long)&startingPosition.field_0 + 4));
  iVar1 = vector3_equals((vector3 *)((long)&translation.field_0 + 4),(vector3 *)local_74);
  if (iVar1 == 0) {
    transform.field_0._56_8_ = anon_var_dwarf_75f;
  }
  else {
    transform.field_0._56_8_ = 0;
  }
  return (char *)transform.field_0._56_8_;
}

Assistant:

static char *test_matrix4_transformation_translatev3(void)
{
	struct matrix4 transform;

	struct vector3 startingPosition = {0.0f, 1.0f, 0.0f};
	struct vector3 translation = {0.1f, 0.1f, 0.1f};
	struct vector3 expectedPosition = {0.1f, 1.1f, 0.1f};

	matrix4_make_transformation_translationv3(&transform, &translation);
	vector3_multiplym4(&startingPosition, &transform);
	test_assert(vector3_equals(&startingPosition, &expectedPosition));

	return NULL;
}